

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O3

bool __thiscall gnilk::IPCResultSummary::Marshal(IPCResultSummary *this,IPCEncoderBase *encoder)

{
  pointer ppIVar1;
  IPCTestResults **tr;
  pointer ppIVar2;
  
  (**(code **)(*(long *)encoder + 0x18))(encoder,0x80);
  (**(code **)(*(long *)encoder + 0x48))(encoder,this->testsExecuted);
  (**(code **)(*(long *)encoder + 0x48))(encoder,this->testsFailed);
  (**(code **)(*(long *)encoder + 0x80))(this->durationSec,encoder);
  (**(code **)(*(long *)encoder + 0x28))
            (encoder,(uint)(*(int *)&(this->testResults).
                                     super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->testResults).
                                    super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff);
  ppIVar1 = (this->testResults).
            super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->testResults).
                 super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    (*((*ppIVar2)->super_IPCSerializer)._vptr_IPCSerializer[2])(*ppIVar2,encoder);
  }
  (**(code **)(*(long *)encoder + 0x30))(encoder);
  (**(code **)(*(long *)encoder + 0x20))(encoder);
  return true;
}

Assistant:

bool IPCResultSummary::Marshal(gnilk::IPCEncoderBase &encoder) const {

    encoder.BeginObject(kMsgType_ResultSummary);
    encoder.WriteI32(testsExecuted);
    encoder.WriteI32(testsFailed);
    encoder.WriteDouble(durationSec);
    encoder.BeginArray(testResults.size());
    for (auto &tr : testResults) {
        tr->Marshal(encoder);
    }
    encoder.EndArray();
    encoder.EndObject();
    return true;
}